

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O0

void DumpData(Res res,DataType dt,int nchan,void *data,string *prefix)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  void *__ptr_00;
  undefined8 uVar6;
  ostream *poVar7;
  float *dst;
  long in_RCX;
  int in_EDX;
  DataType in_ESI;
  string *in_R8;
  int c;
  uint8_t *dpixel;
  int ui;
  int vi;
  int pixelSize;
  int vres;
  int ures;
  uint8_t *cpixel;
  float *pixel;
  int in_stack_ffffffffffffffac;
  int local_44;
  int local_40;
  Res local_2;
  
  __ptr = malloc((long)in_EDX << 2);
  __ptr_00 = malloc((long)in_EDX);
  uVar6 = std::__cxx11::string::c_str();
  uVar1 = Ptex::v2_4::Res::u(&local_2);
  uVar2 = Ptex::v2_4::Res::v(&local_2);
  printf("%sdata (%d x %d):\n",uVar6,(ulong)uVar1,(ulong)uVar2);
  iVar3 = Ptex::v2_4::Res::u(&local_2);
  iVar4 = Ptex::v2_4::Res::v(&local_2);
  iVar5 = Ptex::v2_4::DataSize(in_ESI);
  for (local_40 = 0; local_40 < iVar4; local_40 = local_40 + 1) {
    if ((local_40 == 8) && (0x10 < iVar4)) {
      local_40 = iVar4 + -8;
      poVar7 = std::operator<<((ostream *)&std::cout,in_R8);
      poVar7 = std::operator<<(poVar7,"  ...");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,in_R8);
    std::operator<<(poVar7,"  ");
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      if ((local_44 == 8) && (0x10 < iVar3)) {
        local_44 = iVar3 + -8;
        std::operator<<((ostream *)&std::cout,"... ");
      }
      dst = (float *)(in_RCX + (local_40 * iVar3 + local_44) * iVar5 * in_EDX);
      Ptex::v2_4::ConvertToFloat
                (dst,(void *)CONCAT44(in_stack_ffffffffffffffac,uVar1),
                 (DataType)((ulong)uVar6 >> 0x20),(int)uVar6);
      Ptex::v2_4::ConvertFromFloat
                (dst,(float *)CONCAT44(in_stack_ffffffffffffffac,uVar1),
                 (DataType)((ulong)uVar6 >> 0x20),(int)uVar6);
      for (in_stack_ffffffffffffffac = 0; in_stack_ffffffffffffffac < in_EDX;
          in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
        printf("%02x",(ulong)*(byte *)((long)__ptr_00 + (long)in_stack_ffffffffffffffac));
      }
      printf(" ");
    }
    printf("\n");
  }
  free(__ptr_00);
  free(__ptr);
  return;
}

Assistant:

void DumpData(Ptex::Res res, Ptex::DataType dt, int nchan, void* data, std::string prefix)
{
    float* pixel = (float*) malloc(sizeof(float)*nchan);
    uint8_t* cpixel = (uint8_t*) malloc(sizeof(uint8_t)*nchan);
    printf("%sdata (%d x %d):\n", prefix.c_str(), res.u(), res.v());
    int ures = res.u(), vres = res.v();
    int pixelSize = Ptex::DataSize(dt) * nchan;
        
    for (int vi = 0; vi < vres; vi++) {
        if (vi == 8 && vres > 16) { vi = vres-8; std::cout << prefix << "  ..." << std::endl; }
        std::cout << prefix << "  ";
        for (int ui = 0; ui < ures; ui++) {
            if (ui == 8 && ures > 16) { ui = ures-8; std::cout << "... "; }
            uint8_t* dpixel = (uint8_t*)data + (vi * ures + ui) * pixelSize;
            Ptex::ConvertToFloat(pixel, dpixel, dt, nchan);
            Ptex::ConvertFromFloat(cpixel, pixel, Ptex::dt_uint8, nchan);
            for (int c=0; c < nchan; c++) {
                printf("%02x", cpixel[c]);
            }
            printf(" ");
        }
        printf("\n");
    }

    free(cpixel);
    free(pixel);
}